

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O3

UChar32 __thiscall icu_63::RegexCompile::scanNamedChar(RegexCompile *this)

{
  RegexPatternChar *c;
  int srcChar;
  UBool UVar1;
  UChar32 UVar2;
  undefined4 length;
  UnicodeString charName;
  char name [100];
  UnicodeString local_c8;
  char local_88 [104];
  
  UVar2 = 0;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    c = &this->fC;
    nextChar(this,c);
    if ((this->fC).fChar == 0x7b) {
      local_c8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70
      ;
      local_c8.fUnion.fStackFields.fLengthAndFlags = 2;
      while( true ) {
        nextChar(this,c);
        srcChar = c->fChar;
        if (srcChar == -1) break;
        if (srcChar == 0x7d) {
          if ((local_c8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
            if ((local_c8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
              local_c8.fUnion.fFields.fArray = local_c8.fUnion.fStackFields.fBuffer;
            }
          }
          else {
            local_c8.fUnion.fFields.fArray = (char16_t *)0x0;
          }
          length = local_c8.fUnion.fFields.fLength;
          if (-1 < local_c8.fUnion.fStackFields.fLengthAndFlags) {
            length = (int)local_c8.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UVar1 = uprv_isInvariantUString_63(local_c8.fUnion.fFields.fArray,length);
          if (UVar1 != '\0') {
            if (-1 < local_c8.fUnion.fStackFields.fLengthAndFlags) {
              local_c8.fUnion.fFields.fLength =
                   (int)local_c8.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if ((uint)local_c8.fUnion.fFields.fLength < 100) {
              icu_63::UnicodeString::extract
                        (&local_c8,0,local_c8.fUnion.fFields.fLength,local_88,100,kInvariant);
              UVar2 = u_charFromName_63(U_UNICODE_CHAR_NAME,local_88,this->fStatus);
              if (U_ZERO_ERROR < *this->fStatus) {
                error(this,U_REGEX_PROPERTY_SYNTAX);
              }
              nextChar(this,c);
              goto LAB_0026c152;
            }
          }
          UVar2 = 0;
          error(this,U_REGEX_PROPERTY_SYNTAX);
          goto LAB_0026c152;
        }
        icu_63::UnicodeString::append(&local_c8,srcChar);
      }
      UVar2 = 0;
      error(this,U_REGEX_PROPERTY_SYNTAX);
LAB_0026c152:
      icu_63::UnicodeString::~UnicodeString(&local_c8);
    }
    else {
      error(this,U_REGEX_PROPERTY_SYNTAX);
      UVar2 = 0;
    }
  }
  return UVar2;
}

Assistant:

UChar32  RegexCompile::scanNamedChar() {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }

    nextChar(fC);
    if (fC.fChar != chLBrace) {
        error(U_REGEX_PROPERTY_SYNTAX);
        return 0;
    }

    UnicodeString  charName;
    for (;;) {
        nextChar(fC);
        if (fC.fChar == chRBrace) {
            break;
        }
        if (fC.fChar == -1) {
            error(U_REGEX_PROPERTY_SYNTAX);
            return 0;
        }
        charName.append(fC.fChar);
    }

    char name[100];
    if (!uprv_isInvariantUString(charName.getBuffer(), charName.length()) ||
         (uint32_t)charName.length()>=sizeof(name)) {
        // All Unicode character names have only invariant characters.
        // The API to get a character, given a name, accepts only char *, forcing us to convert,
        //   which requires this error check
        error(U_REGEX_PROPERTY_SYNTAX);
        return 0;
    }
    charName.extract(0, charName.length(), name, sizeof(name), US_INV);

    UChar32  theChar = u_charFromName(U_UNICODE_CHAR_NAME, name, fStatus);
    if (U_FAILURE(*fStatus)) {
        error(U_REGEX_PROPERTY_SYNTAX);
    }

    nextChar(fC);      // Continue overall regex pattern processing with char after the '}'
    return theChar;
}